

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt32x4OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDInt32x4Operation::OpMul(SIMDValue *aValue,SIMDValue *bValue)

{
  undefined1 auVar1 [16];
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  
  auVar1 = *(undefined1 (*) [16])(bValue->field_0).i32;
  auVar3._0_8_ = (ulong)auVar1._0_4_ * (ulong)(aValue->field_0).u32[0];
  auVar3._8_8_ = (auVar1._8_8_ & 0xffffffff) * (ulong)(aValue->field_0).u32[2];
  iVar4 = auVar1._4_4_ * (aValue->field_0).i32[1];
  iVar5 = auVar1._12_4_ * (aValue->field_0).i32[3];
  auVar1._4_4_ = iVar4;
  auVar1._0_4_ = iVar4;
  auVar1._8_4_ = iVar5;
  auVar1._12_4_ = iVar5;
  aVar2 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)pblendw(auVar1,auVar3,0x33);
  return (SIMDValue)aVar2;
}

Assistant:

SIMDValue SIMDInt32x4Operation::OpMul(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        SIMDValue result;
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);

        // a * b, only available in SSE4
        // x86Result.m128i_value = _mm_mullo_epi32(tmpaValue.m128i_value, tmpbValue.m128i_value);
        // result = X86SIMDValue::ToSIMDValue(x86Result);

        // SSE2
        // mul 2,0: r0 = a0*b0; r1 = a2*b2
        __m128i tmp1 = _mm_mul_epu32(tmpaValue.m128i_value, tmpbValue.m128i_value);
        // mul 3,1: r0=a1*b1; r1=a3*b3
        __m128i tmp2 = _mm_mul_epu32(_mm_srli_si128(tmpaValue.m128i_value, 4), _mm_srli_si128(tmpbValue.m128i_value, 4));
        // shuffle x86Results to [63..0] and pack
        x86Result.m128i_value = _mm_unpacklo_epi32(_mm_shuffle_epi32(tmp1, _MM_SHUFFLE(0, 0, 2, 0)), _mm_shuffle_epi32(tmp2, _MM_SHUFFLE(0, 0, 2, 0)));
        result = X86SIMDValue::ToSIMDValue(x86Result);

        return result;
    }